

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void aom_hadamard_4x4_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined8 *puVar1;
  longlong *plVar2;
  __m128i a;
  __m128i a_00;
  long in_RSI;
  long in_RDI;
  __m128i src [4];
  tran_low_t *b;
  longlong lVar3;
  longlong lVar4;
  int iter;
  __m128i *in;
  
  puVar1 = (undefined8 *)(in_RDI + in_RSI * 2);
  b = (tran_low_t *)*puVar1;
  lVar3 = 0;
  plVar2 = (longlong *)((long)puVar1 + in_RSI * 2);
  lVar4 = *plVar2;
  iter = 0;
  in = *(__m128i **)((long)plVar2 + in_RSI * 2);
  hadamard_col4_sse2(in,0);
  hadamard_col4_sse2(in,iter);
  a[1] = lVar4;
  a[0] = lVar3;
  store_tran_low(a,b);
  a_00[1] = lVar4;
  a_00[0] = lVar3;
  store_tran_low(a_00,b);
  return;
}

Assistant:

void aom_hadamard_4x4_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                           tran_low_t *coeff) {
  __m128i src[4];
  src[0] = _mm_loadl_epi64((const __m128i *)src_diff);
  src[1] = _mm_loadl_epi64((const __m128i *)(src_diff += src_stride));
  src[2] = _mm_loadl_epi64((const __m128i *)(src_diff += src_stride));
  src[3] = _mm_loadl_epi64((const __m128i *)(src_diff + src_stride));

  hadamard_col4_sse2(src, 0);
  hadamard_col4_sse2(src, 1);

  store_tran_low(_mm_unpacklo_epi64(src[0], src[1]), coeff);
  coeff += 8;
  store_tran_low(_mm_unpacklo_epi64(src[2], src[3]), coeff);
}